

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

string * __thiscall
cppcms::session_interface::get_csrf_token_cookie_name_abi_cxx11_
          (string *__return_storage_ptr__,session_interface *this)

{
  cached_settings *pcVar1;
  
  pcVar1 = cached_settings(this);
  std::operator+(__return_storage_ptr__,&(pcVar1->session).cookies.prefix,"__csrf");
  return __return_storage_ptr__;
}

Assistant:

std::string session_interface::get_csrf_token_cookie_name()
{
	return cached_settings().session.cookies.prefix + "__csrf"; // one for suffix and one for _csrf
}